

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

string * __thiscall
Json::Reader::normalizeEOL_abi_cxx11_
          (string *__return_storage_ptr__,Reader *this,Location begin,Location end)

{
  char cVar1;
  Reader *pRVar2;
  Reader *pRStack_40;
  char c;
  Location current;
  Location end_local;
  Location begin_local;
  string *normalized;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  pRStack_40 = this;
  while (pRStack_40 != (Reader *)begin) {
    pRVar2 = (Reader *)
             ((long)&(pRStack_40->nodes_).c.
                     super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                     super__Deque_impl_data._M_map + 1);
    cVar1 = *(char *)&(pRStack_40->nodes_).c.
                      super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                      super__Deque_impl_data._M_map;
    if (cVar1 == '\r') {
      if ((pRVar2 != (Reader *)begin) &&
         (*(char *)&(pRVar2->nodes_).c.
                    super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                    super__Deque_impl_data._M_map == '\n')) {
        pRVar2 = (Reader *)
                 ((long)&(pRStack_40->nodes_).c.
                         super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                         super__Deque_impl_data._M_map + 2);
      }
      pRStack_40 = pRVar2;
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\n');
    }
    else {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar1);
      pRStack_40 = pRVar2;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

JSONCPP_STRING Reader::normalizeEOL(Reader::Location begin, Reader::Location end) {
  JSONCPP_STRING normalized;
  normalized.reserve(static_cast<size_t>(end - begin));
  Reader::Location current = begin;
  while (current != end) {
    char c = *current++;
    if (c == '\r') {
      if (current != end && *current == '\n')
         // convert dos EOL
         ++current;
      // convert Mac EOL
      normalized += '\n';
    } else {
      normalized += c;
    }
  }
  return normalized;
}